

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void __thiscall
cubeb_passthrough_resampler_fill_eq_input_Test::~cubeb_passthrough_resampler_fill_eq_input_Test
          (cubeb_passthrough_resampler_fill_eq_input_Test *this)

{
  void *in_RDI;
  
  ~cubeb_passthrough_resampler_fill_eq_input_Test
            ((cubeb_passthrough_resampler_fill_eq_input_Test *)0x110938);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(cubeb, passthrough_resampler_fill_eq_input) {
  uint32_t channels = 2;
  uint32_t sample_rate = 44100;
  passthrough_resampler<float> resampler =
    passthrough_resampler<float>(nullptr, passthrough_resampler_fill_eq_input,
                                 nullptr, channels, sample_rate);

  long input_frame_count = 32;
  long output_frame_count = 32;
  float input[64] = {};
  float output[64] = {};
  for (uint32_t i = 0; i < input_frame_count * channels; ++i) {
    input[i] = 0.01 * i;
  }
  long got = resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used must be equal to output frames.
  ASSERT_EQ(input_frame_count, output_frame_count);
}